

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threading_pthreads.cpp
# Opt level: O1

void __thiscall crnlib::task_pool::deinit(task_pool *this)

{
  ulong uVar1;
  
  if (this->m_num_threads != 0) {
    join(this);
    LOCK();
    this->m_exit_flag = 1;
    UNLOCK();
    semaphore::release(&this->m_tasks_available,(ulong)this->m_num_threads);
    if (this->m_num_threads != 0) {
      uVar1 = 0;
      do {
        pthread_join(this->m_threads[uVar1],(void **)0x0);
        uVar1 = uVar1 + 1;
      } while (uVar1 < this->m_num_threads);
    }
    this->m_num_threads = 0;
    LOCK();
    this->m_exit_flag = 0;
    UNLOCK();
  }
  spinlock::lock((spinlock *)this);
  (this->m_task_stack).m_top = 0;
  spinlock::unlock((spinlock *)this);
  this->m_total_submitted_tasks = 0;
  this->m_total_completed_tasks = 0;
  return;
}

Assistant:

void task_pool::deinit()
    {
        if (m_num_threads)
        {
            join();

            atomic_exchange32(&m_exit_flag, true);

            m_tasks_available.release(m_num_threads);

            for (uint i = 0; i < m_num_threads; i++)
            {
                pthread_join(m_threads[i], nullptr);
            }

            m_num_threads = 0;

            atomic_exchange32(&m_exit_flag, false);
        }

        m_task_stack.clear();
        m_total_submitted_tasks = 0;
        m_total_completed_tasks = 0;
    }